

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O3

void icu_63::_set_addString(USet *set,UChar *str,int32_t length)

{
  ConstChar16Ptr local_60 [3];
  UnicodeString local_48;
  
  local_60[0].p_ = str;
  UnicodeString::UnicodeString(&local_48,(byte)((uint)length >> 0x1f),local_60,length);
  UnicodeSet::add((UnicodeSet *)set,&local_48);
  UnicodeString::~UnicodeString(&local_48);
  return;
}

Assistant:

static void U_CALLCONV
_set_addString(USet *set, const UChar *str, int32_t length) {
    ((UnicodeSet *)set)->add(UnicodeString((UBool)(length<0), str, length));
}